

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::InstanceArrayIntersectorK<4>_>,_false>
     ::intersect(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,RayQueryContext *context)

{
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  bool bVar5;
  bool bVar6;
  undefined8 uVar7;
  uint i;
  long lVar8;
  NodeRef *pNVar9;
  size_t sVar10;
  NodeRef nodeRef;
  size_t sVar11;
  size_t sVar12;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar13;
  size_t sVar14;
  Primitive_conflict4 *prim;
  bool bVar15;
  ulong uVar16;
  ulong uVar17;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar30;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar31;
  undefined1 auVar32 [64];
  vint4 ai_2;
  undefined1 in_ZMM1 [64];
  vint4 ai;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar33;
  vint4 ai_1;
  vint4 ai_3;
  undefined1 auVar34 [16];
  vint4 bi;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  vint4 bi_1;
  undefined1 auVar37 [16];
  vint4 bi_3;
  undefined1 auVar38 [16];
  vint4 bi_2;
  undefined1 auVar39 [16];
  undefined1 auVar40 [64];
  undefined1 auVar41 [16];
  undefined1 auVar42 [64];
  vbool<4>_conflict valid_leaf;
  Precalculations pre;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  undefined1 auVar18 [16];
  
  sVar14 = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (sVar14 != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      intersectCoherent(valid_i,This,ray,context);
      return;
    }
    auVar26 = vpcmpeqd_avx(in_ZMM1._0_16_,in_ZMM1._0_16_);
    uVar16 = vpcmpeqd_avx512vl((undefined1  [16])valid_i->field_0,auVar26);
    uVar16 = uVar16 & 0xf;
    if ((byte)uVar16 != 0) {
      auVar26 = *(undefined1 (*) [16])(ray + 0x40);
      auVar21 = *(undefined1 (*) [16])(ray + 0x50);
      auVar3 = *(undefined1 (*) [16])(ray + 0x60);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar40 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar25 = *(undefined1 (*) [16])ray;
      auVar29._0_8_ = auVar25._0_8_ ^ 0x8000000080000000;
      auVar29._8_4_ = -auVar25._8_4_;
      auVar29._12_4_ = -auVar25._12_4_;
      auVar18 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),(undefined1  [16])0x0);
      bVar15 = (bool)((byte)uVar16 & 1);
      aVar19._0_4_ = (uint)bVar15 * auVar18._0_4_ | (uint)!bVar15 * 0x7f800000;
      bVar15 = (bool)((byte)(uVar16 >> 1) & 1);
      aVar19._4_4_ = (uint)bVar15 * auVar18._4_4_ | (uint)!bVar15 * 0x7f800000;
      bVar15 = (bool)((byte)(uVar16 >> 2) & 1);
      aVar19._8_4_ = (uint)bVar15 * auVar18._8_4_ | (uint)!bVar15 * 0x7f800000;
      bVar15 = SUB81(uVar16 >> 3,0);
      aVar19._12_4_ = (uint)bVar15 * auVar18._12_4_ | (uint)!bVar15 * 0x7f800000;
      auVar18 = *(undefined1 (*) [16])(ray + 0x10);
      auVar20 = *(undefined1 (*) [16])(ray + 0x20);
      auVar35._0_8_ = auVar20._0_8_ ^ 0x8000000080000000;
      auVar35._8_4_ = auVar20._8_4_ ^ 0x80000000;
      auVar35._12_4_ = auVar20._12_4_ ^ 0x80000000;
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_node[1].ptr = sVar14;
      stack_near[1].field_0 = aVar19;
      if (sVar14 != 0xfffffffffffffff8) {
        auVar22._8_4_ = 0x7fffffff;
        auVar22._0_8_ = 0x7fffffff7fffffff;
        auVar22._12_4_ = 0x7fffffff;
        auVar20 = vandps_avx(auVar26,auVar22);
        auVar23._8_4_ = 0x219392ef;
        auVar23._0_8_ = 0x219392ef219392ef;
        auVar23._12_4_ = 0x219392ef;
        uVar16 = vcmpps_avx512vl(auVar20,auVar23,1);
        bVar15 = (bool)((byte)uVar16 & 1);
        auVar20._0_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar26._0_4_;
        bVar15 = (bool)((byte)(uVar16 >> 1) & 1);
        auVar20._4_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar26._4_4_;
        bVar15 = (bool)((byte)(uVar16 >> 2) & 1);
        auVar20._8_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar26._8_4_;
        bVar15 = (bool)((byte)(uVar16 >> 3) & 1);
        auVar20._12_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar26._12_4_;
        auVar26 = vandps_avx(auVar21,auVar22);
        uVar16 = vcmpps_avx512vl(auVar26,auVar23,1);
        bVar15 = (bool)((byte)uVar16 & 1);
        auVar24._0_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar21._0_4_;
        bVar15 = (bool)((byte)(uVar16 >> 1) & 1);
        auVar24._4_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar21._4_4_;
        bVar15 = (bool)((byte)(uVar16 >> 2) & 1);
        auVar24._8_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar21._8_4_;
        bVar15 = (bool)((byte)(uVar16 >> 3) & 1);
        auVar24._12_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar21._12_4_;
        auVar26 = vandps_avx(auVar3,auVar22);
        uVar16 = vcmpps_avx512vl(auVar26,auVar23,1);
        bVar15 = (bool)((byte)uVar16 & 1);
        auVar21._0_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar3._0_4_;
        bVar15 = (bool)((byte)(uVar16 >> 1) & 1);
        auVar21._4_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar3._4_4_;
        bVar15 = (bool)((byte)(uVar16 >> 2) & 1);
        auVar21._8_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar3._8_4_;
        bVar15 = (bool)((byte)(uVar16 >> 3) & 1);
        auVar21._12_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar3._12_4_;
        auVar22 = vrcp14ps_avx512vl(auVar20);
        auVar27._8_4_ = 0x3f800000;
        auVar27._0_8_ = 0x3f8000003f800000;
        auVar27._12_4_ = 0x3f800000;
        auVar26 = vfnmadd213ps_fma(auVar20,auVar22,auVar27);
        auVar23 = vrcp14ps_avx512vl(auVar24);
        auVar3 = vfnmadd213ps_fma(auVar24,auVar23,auVar27);
        auVar24 = vrcp14ps_avx512vl(auVar21);
        auVar20 = vfnmadd213ps_fma(auVar21,auVar24,auVar27);
        auVar21 = vfmadd132ps_fma(auVar26,auVar22,auVar22);
        auVar3 = vfmadd132ps_fma(auVar3,auVar23,auVar23);
        auVar20 = vfmadd132ps_fma(auVar20,auVar24,auVar24);
        auVar39._0_4_ = auVar21._0_4_ * -auVar25._0_4_;
        auVar39._4_4_ = auVar21._4_4_ * -auVar25._4_4_;
        auVar39._8_4_ = auVar21._8_4_ * auVar29._8_4_;
        auVar39._12_4_ = auVar21._12_4_ * auVar29._12_4_;
        auVar41._0_4_ = auVar3._0_4_ * -auVar18._0_4_;
        auVar41._4_4_ = auVar3._4_4_ * -auVar18._4_4_;
        auVar41._8_4_ = auVar3._8_4_ * -auVar18._8_4_;
        auVar41._12_4_ = auVar3._12_4_ * -auVar18._12_4_;
        auVar25 = vmulps_avx512vl(auVar20,auVar35);
        auVar26 = vpcmpeqd_avx(auVar29,auVar29);
        uVar16 = vpcmpeqd_avx512vl((undefined1  [16])valid_i->field_0,auVar26);
        uVar16 = uVar16 & 0xf;
        auVar26 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        pNVar9 = stack_node + 1;
        auVar18 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),(undefined1  [16])0x0);
        bVar15 = (bool)((byte)uVar16 & 1);
        bVar4 = (bool)((byte)(uVar16 >> 1) & 1);
        bVar5 = (bool)((byte)(uVar16 >> 2) & 1);
        bVar6 = SUB81(uVar16 >> 3,0);
        auVar42 = ZEXT1664(CONCAT412((uint)bVar6 * auVar18._12_4_ | (uint)!bVar6 * auVar26._12_4_,
                                     CONCAT48((uint)bVar5 * auVar18._8_4_ |
                                              (uint)!bVar5 * auVar26._8_4_,
                                              CONCAT44((uint)bVar4 * auVar18._4_4_ |
                                                       (uint)!bVar4 * auVar26._4_4_,
                                                       (uint)bVar15 * auVar18._0_4_ |
                                                       (uint)!bVar15 * auVar26._0_4_))));
        paVar13 = &stack_near[2].field_0;
        do {
          paVar1 = paVar13 + -1;
          auVar32 = ZEXT1664((undefined1  [16])*paVar1);
          paVar13 = paVar13 + -1;
          auVar26 = auVar42._0_16_;
          uVar7 = vcmpps_avx512vl((undefined1  [16])*paVar1,auVar26,1);
          if ((char)uVar7 != '\0') {
            while ((sVar14 & 8) == 0) {
              lVar8 = 0;
              uVar16 = 0;
              auVar32 = ZEXT1664(auVar40._0_16_);
              sVar11 = 8;
              do {
                sVar12 = *(size_t *)((sVar14 & 0xfffffffffffffff0) + lVar8 * 8);
                if (sVar12 == 8) break;
                uVar2 = *(undefined4 *)(sVar14 + 0x40 + lVar8 * 4);
                auVar18._4_4_ = uVar2;
                auVar18._0_4_ = uVar2;
                auVar18._8_4_ = uVar2;
                auVar18._12_4_ = uVar2;
                auVar35 = vfmadd132ps_fma(auVar18,auVar39,auVar21);
                uVar2 = *(undefined4 *)(sVar14 + 0x80 + lVar8 * 4);
                auVar28._4_4_ = uVar2;
                auVar28._0_4_ = uVar2;
                auVar28._8_4_ = uVar2;
                auVar28._12_4_ = uVar2;
                auVar24 = vfmadd132ps_fma(auVar28,auVar41,auVar3);
                uVar2 = *(undefined4 *)(sVar14 + 0xc0 + lVar8 * 4);
                auVar34._4_4_ = uVar2;
                auVar34._0_4_ = uVar2;
                auVar34._8_4_ = uVar2;
                auVar34._12_4_ = uVar2;
                auVar27 = vfmadd132ps_avx512vl(auVar34,auVar25,auVar20);
                uVar2 = *(undefined4 *)(sVar14 + 0x60 + lVar8 * 4);
                auVar36._4_4_ = uVar2;
                auVar36._0_4_ = uVar2;
                auVar36._8_4_ = uVar2;
                auVar36._12_4_ = uVar2;
                auVar22 = vfmadd132ps_fma(auVar36,auVar39,auVar21);
                uVar2 = *(undefined4 *)(sVar14 + 0xa0 + lVar8 * 4);
                auVar37._4_4_ = uVar2;
                auVar37._0_4_ = uVar2;
                auVar37._8_4_ = uVar2;
                auVar37._12_4_ = uVar2;
                auVar23 = vfmadd132ps_fma(auVar37,auVar41,auVar3);
                uVar2 = *(undefined4 *)(sVar14 + 0xe0 + lVar8 * 4);
                auVar38._4_4_ = uVar2;
                auVar38._0_4_ = uVar2;
                auVar38._8_4_ = uVar2;
                auVar38._12_4_ = uVar2;
                auVar28 = vfmadd132ps_avx512vl(auVar38,auVar25,auVar20);
                auVar18 = vpminsd_avx(auVar35,auVar22);
                auVar29 = vpminsd_avx(auVar24,auVar23);
                auVar18 = vpmaxsd_avx(auVar18,auVar29);
                auVar29 = vpminsd_avx(auVar27,auVar28);
                auVar18 = vpmaxsd_avx(auVar18,auVar29);
                auVar29 = vpmaxsd_avx(auVar35,auVar22);
                auVar35 = vpmaxsd_avx(auVar24,auVar23);
                auVar24 = vpminsd_avx(auVar29,auVar35);
                auVar29 = vpmaxsd_avx(auVar27,auVar28);
                auVar35 = vpmaxsd_avx(auVar18,(undefined1  [16])aVar19);
                auVar29 = vpminsd_avx512vl(auVar29,auVar26);
                auVar29 = vpminsd_avx(auVar24,auVar29);
                uVar17 = vpcmpd_avx512vl(auVar35,auVar29,2);
                uVar17 = uVar17 & 0xf;
                if ((byte)uVar17 != 0) {
                  auVar29 = vblendmps_avx512vl(auVar40._0_16_,auVar18);
                  bVar15 = (bool)((byte)uVar17 & 1);
                  aVar30._0_4_ = (uint)bVar15 * auVar29._0_4_ | (uint)!bVar15 * auVar18._0_4_;
                  bVar15 = (bool)((byte)(uVar17 >> 1) & 1);
                  aVar30._4_4_ = (uint)bVar15 * auVar29._4_4_ | (uint)!bVar15 * auVar18._4_4_;
                  bVar15 = (bool)((byte)(uVar17 >> 2) & 1);
                  aVar30._8_4_ = (uint)bVar15 * auVar29._8_4_ | (uint)!bVar15 * auVar18._8_4_;
                  bVar15 = SUB81(uVar17 >> 3,0);
                  aVar30._12_4_ = (uint)bVar15 * auVar29._12_4_ | (uint)!bVar15 * auVar18._12_4_;
                  aVar31 = auVar32._0_16_;
                  uVar7 = vcmpps_avx512vl((undefined1  [16])aVar30,(undefined1  [16])aVar31,1);
                  sVar10 = sVar12;
                  aVar33 = aVar30;
                  if (((char)uVar7 == '\0') ||
                     (bVar15 = sVar11 != 8, sVar10 = sVar11, sVar11 = sVar12, aVar33 = aVar31,
                     aVar31 = aVar30, bVar15)) {
                    aVar30 = aVar31;
                    uVar16 = uVar16 + 1;
                    pNVar9->ptr = sVar10;
                    pNVar9 = pNVar9 + 1;
                    *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar13->v = aVar33;
                    paVar13 = paVar13 + 1;
                    sVar12 = sVar11;
                  }
                  auVar32 = ZEXT1664((undefined1  [16])aVar30);
                  sVar11 = sVar12;
                }
                lVar8 = lVar8 + 1;
              } while (lVar8 != 8);
              if (sVar11 == 8) goto LAB_00776b2b;
              sVar14 = sVar11;
              if (1 < uVar16) {
                aVar33 = paVar13[-2];
                aVar30 = paVar13[-1];
                uVar7 = vcmpps_avx512vl((undefined1  [16])aVar33,(undefined1  [16])aVar30,1);
                aVar31 = aVar30;
                if ((char)uVar7 != '\0') {
                  paVar13[-2] = aVar30;
                  paVar13[-1] = aVar33;
                  auVar18 = vpermilps_avx(*(undefined1 (*) [16])(pNVar9 + -2),0x4e);
                  *(undefined1 (*) [16])(pNVar9 + -2) = auVar18;
                  aVar31 = aVar33;
                  aVar33 = aVar30;
                }
                if (uVar16 != 2) {
                  aVar30 = paVar13[-3];
                  uVar7 = vcmpps_avx512vl((undefined1  [16])aVar30,(undefined1  [16])aVar31,1);
                  if ((char)uVar7 != '\0') {
                    paVar13[-3] = aVar31;
                    paVar13[-1] = aVar30;
                    sVar11 = pNVar9[-3].ptr;
                    pNVar9[-3].ptr = pNVar9[-1].ptr;
                    pNVar9[-1].ptr = sVar11;
                    aVar30 = aVar31;
                  }
                  uVar7 = vcmpps_avx512vl((undefined1  [16])aVar30,(undefined1  [16])aVar33,1);
                  if ((char)uVar7 != '\0') {
                    paVar13[-3] = aVar33;
                    paVar13[-2] = aVar30;
                    auVar18 = vpermilps_avx(*(undefined1 (*) [16])(pNVar9 + -3),0x4e);
                    *(undefined1 (*) [16])(pNVar9 + -3) = auVar18;
                  }
                }
              }
            }
            if (sVar14 == 0xfffffffffffffff8) {
              return;
            }
            uVar16 = vcmpps_avx512vl(auVar26,auVar32._0_16_,6);
            valid_leaf.v = (__mmask8)uVar16;
            if (valid_leaf.v != '\0') {
              lVar8 = (ulong)((uint)sVar14 & 0xf) - 8;
              if (lVar8 != 0) {
                prim = (Primitive_conflict4 *)(sVar14 & 0xfffffffffffffff0);
                do {
                  InstanceArrayIntersectorK<4>::intersect(&valid_leaf,&pre,ray,context,prim);
                  prim = prim + 1;
                  lVar8 = lVar8 + -1;
                } while (lVar8 != 0);
                uVar16 = (ulong)valid_leaf.v;
                auVar40 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              }
              bVar15 = (bool)((byte)uVar16 & 1);
              bVar4 = (bool)((byte)(uVar16 >> 1) & 1);
              bVar5 = (bool)((byte)(uVar16 >> 2) & 1);
              bVar6 = (bool)((byte)(uVar16 >> 3) & 1);
              auVar42 = ZEXT1664(CONCAT412((uint)bVar6 * *(int *)(ray + 0x8c) |
                                           (uint)!bVar6 * auVar42._12_4_,
                                           CONCAT48((uint)bVar5 * *(int *)(ray + 0x88) |
                                                    (uint)!bVar5 * auVar42._8_4_,
                                                    CONCAT44((uint)bVar4 * *(int *)(ray + 0x84) |
                                                             (uint)!bVar4 * auVar42._4_4_,
                                                             (uint)bVar15 * *(int *)(ray + 0x80) |
                                                             (uint)!bVar15 * auVar42._0_4_))));
            }
          }
LAB_00776b2b:
          sVar14 = pNVar9[-1].ptr;
          pNVar9 = pNVar9 + -1;
        } while (sVar14 != 0xfffffffffffffff8);
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }